

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODRowReader.h
# Opt level: O2

int ZXing::OneD::RowReader::NarrowWideBitPattern(PatternView *view)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  BarAndSpaceI threshold;
  
  threshold = NarrowWideThreshold(view);
  iVar4 = -1;
  if (0xffff < (uint)threshold && threshold.bar != 0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)view->_size;
    if (view->_size < 1) {
      uVar2 = uVar3;
    }
    iVar4 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = (&threshold.bar)[(uint)uVar3 & 1];
      if ((uint)uVar1 + (uint)uVar1 < (uint)view->_data[uVar3]) {
        return -1;
      }
      iVar4 = (uint)(uVar1 < view->_data[uVar3]) + iVar4 * 2;
    }
  }
  return iVar4;
}

Assistant:

static int NarrowWideBitPattern(const PatternView& view)
	{
		const auto threshold = NarrowWideThreshold(view);
		if (!threshold.isValid())
			return -1;

		int pattern = 0;
		for (int i = 0; i < view.size(); ++i) {
			if (view[i] > threshold[i] * 2)
				return -1;
			AppendBit(pattern, view[i] > threshold[i]);
		}

		return pattern;
	}